

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::RegisterGenerator
          (CommandLineInterface *this,string *flag_name,string *option_flag_name,
          CodeGenerator *generator,string *help_text)

{
  mapped_type *pmVar1;
  undefined1 local_98 [8];
  GeneratorInfo info;
  string *help_text_local;
  CodeGenerator *generator_local;
  string *option_flag_name_local;
  string *flag_name_local;
  CommandLineInterface *this_local;
  
  info.help_text.field_2._8_8_ = help_text;
  GeneratorInfo::GeneratorInfo((GeneratorInfo *)local_98);
  std::__cxx11::string::operator=((string *)local_98,(string *)flag_name);
  std::__cxx11::string::operator=
            ((string *)(info.flag_name.field_2._M_local_buf + 8),(string *)option_flag_name);
  info.option_flag_name.field_2._8_8_ = generator;
  std::__cxx11::string::operator=((string *)&info.generator,(string *)info.help_text.field_2._8_8_);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
           ::operator[](&this->generators_by_flag_name_,flag_name);
  GeneratorInfo::operator=(pmVar1,(GeneratorInfo *)local_98);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
           ::operator[](&this->generators_by_option_name_,option_flag_name);
  GeneratorInfo::operator=(pmVar1,(GeneratorInfo *)local_98);
  GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_98);
  return;
}

Assistant:

void CommandLineInterface::RegisterGenerator(const string& flag_name,
                                             const string& option_flag_name,
                                             CodeGenerator* generator,
                                             const string& help_text) {
  GeneratorInfo info;
  info.flag_name = flag_name;
  info.option_flag_name = option_flag_name;
  info.generator = generator;
  info.help_text = help_text;
  generators_by_flag_name_[flag_name] = info;
  generators_by_option_name_[option_flag_name] = info;
}